

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

wchar_t rl_insert(wchar_t count,wchar_t c)

{
  char local_12 [2];
  wchar_t local_10;
  wchar_t wStack_c;
  char arr [2];
  wchar_t c_local;
  wchar_t count_local;
  
  local_10 = c;
  wStack_c = count;
  if ((h == (History *)0x0) || (e == (EditLine *)0x0)) {
    rl_initialize();
  }
  local_12[0] = (char)local_10;
  local_12[1] = 0;
  for (; L'\0' < wStack_c; wStack_c = wStack_c + L'\xffffffff') {
    el_push(e,local_12);
  }
  return L'\0';
}

Assistant:

int
rl_insert(int count, int c)
{
	char arr[2];

	if (h == NULL || e == NULL)
		rl_initialize();

	/* XXX - int -> char conversion can lose on multichars */
	arr[0] = (char)c;
	arr[1] = '\0';

	for (; count > 0; count--)
		el_push(e, arr);

	return 0;
}